

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeNext(BtCursor *pCur,int *pRes)

{
  short sVar1;
  MemPage *pMVar2;
  byte bVar3;
  u32 uVar4;
  int iVar5;
  ulong uVar6;
  ushort uVar7;
  
  (pCur->info).nSize = 0;
  pCur->curFlags = pCur->curFlags & 0xf9;
  *pRes = 0;
  if (pCur->eState == '\x01') {
    sVar1 = pCur->iPage;
    pMVar2 = pCur->apPage[sVar1];
    uVar7 = pCur->aiIdx[sVar1] + 1;
    pCur->aiIdx[sVar1] = uVar7;
    if (pMVar2->nCell <= uVar7) {
      pCur->aiIdx[pCur->iPage] = pCur->aiIdx[pCur->iPage] - 1;
      iVar5 = btreeNext(pCur,pRes);
      return iVar5;
    }
    if (pMVar2->leaf != '\0') {
      return 0;
    }
    iVar5 = 0;
    while( true ) {
      if (iVar5 != 0) {
        return iVar5;
      }
      pMVar2 = pCur->apPage[pCur->iPage];
      if (pMVar2->leaf != '\0') break;
      uVar4 = sqlite3Get4byte(pMVar2->aData +
                              (CONCAT11(pMVar2->aCellIdx[(ulong)pCur->aiIdx[pCur->iPage] * 2],
                                        pMVar2->aCellIdx[(ulong)pCur->aiIdx[pCur->iPage] * 2 + 1]) &
                              pMVar2->maskPage));
      iVar5 = moveToChild(pCur,uVar4);
    }
    return 0;
  }
  bVar3 = pCur->eState;
  if (bVar3 != 1) {
    if (2 < bVar3) {
      iVar5 = btreeRestoreCursorPosition(pCur);
      if (iVar5 != 0) {
        return iVar5;
      }
      bVar3 = pCur->eState;
    }
    if (bVar3 == 0) {
      *pRes = 1;
      return 0;
    }
    iVar5 = pCur->skipNext;
    if (iVar5 != 0) {
      pCur->eState = '\x01';
      pCur->skipNext = 0;
      if (0 < iVar5) {
        return 0;
      }
    }
  }
  sVar1 = pCur->iPage;
  pMVar2 = pCur->apPage[sVar1];
  uVar7 = pCur->aiIdx[sVar1] + 1;
  pCur->aiIdx[sVar1] = uVar7;
  if (uVar7 < pMVar2->nCell) {
    if (pMVar2->leaf == '\0') {
LAB_001311f3:
      iVar5 = moveToLeftmost(pCur);
      return iVar5;
    }
  }
  else {
    if (pMVar2->leaf == '\0') {
      uVar4 = sqlite3Get4byte(pMVar2->aData + (ulong)pMVar2->hdrOffset + 8);
      iVar5 = moveToChild(pCur,uVar4);
      if (iVar5 != 0) {
        return iVar5;
      }
      goto LAB_001311f3;
    }
    uVar6 = (ulong)(ushort)pCur->iPage;
    do {
      if ((short)uVar6 == 0) {
        *pRes = 1;
        pCur->eState = '\0';
        return 0;
      }
      moveToParent(pCur);
      uVar6 = (ulong)pCur->iPage;
    } while (pCur->apPage[uVar6]->nCell <= pCur->aiIdx[uVar6]);
    if (pCur->apPage[uVar6]->intKey != '\0') {
      iVar5 = sqlite3BtreeNext(pCur,pRes);
      return iVar5;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeNext(BtCursor *pCur, int *pRes){
  MemPage *pPage;
  assert( cursorHoldsMutex(pCur) );
  assert( pRes!=0 );
  assert( *pRes==0 || *pRes==1 );
  assert( pCur->skipNext==0 || pCur->eState!=CURSOR_VALID );
  pCur->info.nSize = 0;
  pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
  *pRes = 0;
  if( pCur->eState!=CURSOR_VALID ) return btreeNext(pCur, pRes);
  pPage = pCur->apPage[pCur->iPage];
  if( (++pCur->aiIdx[pCur->iPage])>=pPage->nCell ){
    pCur->aiIdx[pCur->iPage]--;
    return btreeNext(pCur, pRes);
  }
  if( pPage->leaf ){
    return SQLITE_OK;
  }else{
    return moveToLeftmost(pCur);
  }
}